

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateGlobalSource
          (FileGenerator *this,Printer *printer)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  pointer this_01;
  Options *in_RCX;
  int local_a4;
  undefined1 local_a0 [4];
  int i;
  undefined1 local_80 [8];
  NamespaceOpener ns;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  FileGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&this->variables_);
  GenerateSourceIncludes
            (this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GenerateTables(this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  bVar1 = HasDescriptorMethods(this->file_,&this->options_);
  if (bVar1) {
    GenerateReflectionInitializationCode
              (this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  Namespace_abi_cxx11_
            ((string *)local_a0,(cpp *)this->file_,(FileDescriptor *)&this->options_,in_RCX);
  NamespaceOpener::NamespaceOpener
            ((NamespaceOpener *)local_80,(string *)local_a0,(Formatter *)local_50);
  std::__cxx11::string::~string((string *)local_a0);
  for (local_a4 = 0;
      sVar2 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
              ::size(&this->enum_generators_), (ulong)(long)local_a4 < sVar2;
      local_a4 = local_a4 + 1) {
    this_00 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
              ::operator[](&this->enum_generators_,(long)local_a4);
    this_01 = std::
              unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
              ::operator->(this_00);
    EnumGenerator::GenerateMethods
              (this_01,local_a4,
               (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_80);
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void FileGenerator::GenerateGlobalSource(io::Printer* printer) {
  Formatter format(printer, variables_);
  GenerateSourceIncludes(printer);

  {
    GenerateTables(printer);

    // Define the code to initialize reflection. This code uses a global
    // constructor to register reflection data with the runtime pre-main.
    if (HasDescriptorMethods(file_, options_)) {
      GenerateReflectionInitializationCode(printer);
    }
  }

  NamespaceOpener ns(Namespace(file_, options_), format);

  // Generate enums.
  for (int i = 0; i < enum_generators_.size(); i++) {
    enum_generators_[i]->GenerateMethods(i, printer);
  }
}